

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O2

RotationZ<std::complex<double>_> * __thiscall
qclab::qgates::RotationZ<std::complex<double>_>::operator*=
          (RotationZ<std::complex<double>_> *this,RotationZ<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar2) {
    QRotation<double>::operator*=
              (&(this->super_QRotationGate1<std::complex<double>_>).rotation_,
               &(rhs->super_QRotationGate1<std::complex<double>_>).rotation_);
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/RotationZ.hpp"
                ,0xa3,
                "RotationZ<T> &qclab::qgates::RotationZ<std::complex<double>>::operator*=(const RotationZ<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline RotationZ< T >& operator*=( const RotationZ< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }